

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.cpp
# Opt level: O0

uint16_t rudp::checksum(uint8_t *begin,uint8_t *end)

{
  ulong uVar1;
  unsigned_short *puVar2;
  uint16_t local_44;
  uint local_3c;
  uint sum;
  unsigned_short *wend;
  uint16_t *wbegin;
  size_t length;
  uint8_t *end_local;
  uint8_t *begin_local;
  
  uVar1 = std::distance<unsigned_char_const*>(begin,end);
  if (uVar1 == 0) {
    begin_local._6_2_ = 0xffff;
  }
  else {
    puVar2 = std::next<unsigned_short_const*>((unsigned_short *)begin,uVar1 >> 1);
    local_3c = std::
               accumulate<unsigned_short_const*,unsigned_int,rudp::checksum(unsigned_char_const*,unsigned_char_const*)::__0>
                         (begin,puVar2,0xffff);
    if (((uVar1 & 1) != 0) &&
       (local_3c = (uint)begin[uVar1 - 1] * 0x100 + local_3c, 0xffff < local_3c)) {
      local_3c = local_3c - 0xffff;
    }
    local_44 = (uint16_t)(local_3c ^ 0xffffffff);
    if (((local_3c ^ 0xffffffff) & 0xffff) == 0) {
      local_44 = 0xffff;
    }
    begin_local._6_2_ = local_44;
  }
  return begin_local._6_2_;
}

Assistant:

uint16_t checksum( const uint8_t *begin, const uint8_t *end ) {
    size_t length = std::distance( begin, end );
    if( length == 0 ) return 0xFFFF;
    const auto wbegin = reinterpret_cast< const uint16_t* >( begin );
    const auto wend = std::next( wbegin, length / 2u );
    auto sum = std::accumulate( wbegin, wend, uint32_t( 0xFFFF ), []( uint32_t sum, uint16_t v ) {
      sum += ntohs( v );
      if( sum > 0xFFFF ) sum -= 0xFFFF;
      return sum;
    } );
    if( length % 2 ) {
      sum += uint16_t( begin[ length - 1 ] ) << 8;
      if( sum > 0xFFFF ) sum -= 0xFFFF;
    }
    sum = ~sum;
    return ( uint16_t( sum ) == 0x0000 ) ? 0xFFFF : sum;
  }